

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_power_udev.c
# Opt level: O0

int gsc_set_device_power_control(char *devpath,uint8_t power_control)

{
  int iVar1;
  uint uVar2;
  igsc_log_func_t p_Var3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffff7c8;
  undefined4 uVar8;
  undefined8 in_stack_fffffffffffff7d0;
  undefined4 uVar9;
  igsc_log_func_t igsc_log_func_6;
  igsc_log_func_t igsc_log_func_5;
  igsc_log_func_t igsc_log_func_4;
  igsc_log_func_t igsc_log_func_3;
  igsc_log_func_t igsc_log_func_2;
  igsc_log_func_t igsc_log_func_1;
  igsc_log_func_t igsc_log_func;
  char *pcStack_760;
  int ret;
  char *val;
  udev_device *parent;
  udev_device *dev;
  udev *udev;
  uint8_t power_control_local;
  char *devpath_local;
  char local_728 [8];
  char __time_buf_12 [128];
  char __time_buf_11 [128];
  char __time_buf_10 [128];
  char __time_buf_9 [128];
  char __time_buf_8 [128];
  char __time_buf_7 [128];
  char __time_buf_6 [128];
  char __time_buf_5 [128];
  char __time_buf_4 [128];
  char __time_buf_3 [128];
  char __time_buf_2 [128];
  char __time_buf_1 [128];
  char __time_buf [128];
  undefined1 local_a0 [8];
  stat st;
  
  uVar9 = (undefined4)((ulong)in_stack_fffffffffffff7d0 >> 0x20);
  uVar8 = (undefined4)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
  st.__glibc_reserved[2] = *(__syscall_slong_t *)(in_FS_OFFSET + 0x28);
  parent = (udev_device *)0x0;
  if (power_control == '\x01') {
    pcStack_760 = "on";
  }
  else {
    if (power_control != '\x02') {
      p_Var3 = igsc_get_log_callback_func();
      if (p_Var3 == (igsc_log_func_t)0x0) {
        pcVar4 = gsc_time(__time_buf_1 + 0x78,0x80);
        syslog(3,"%s: IGSC: (%s:%s():%d) Wrong power control %u\n",pcVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
               ,"gsc_set_device_power_control",0x66,CONCAT44(uVar8,(uint)power_control));
      }
      else {
        p_Var3 = igsc_get_log_callback_func();
        pcVar4 = gsc_time(__time_buf_2 + 0x78,0x80);
        (*p_Var3)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Wrong power control %u\n",pcVar4,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
                  ,"gsc_set_device_power_control",0x66,CONCAT44(uVar8,(uint)power_control));
      }
      devpath_local._4_4_ = 1;
      goto LAB_0012bfd9;
    }
    pcStack_760 = "auto";
  }
  lVar5 = udev_new();
  if (lVar5 == 0) {
    p_Var3 = igsc_get_log_callback_func();
    if (p_Var3 == (igsc_log_func_t)0x0) {
      pcVar4 = gsc_time(__time_buf_3 + 0x78,0x80);
      syslog(3,"%s: IGSC: (%s:%s():%d) Cannot create udev\n",pcVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
             ,"gsc_set_device_power_control",0x6d);
    }
    else {
      p_Var3 = igsc_get_log_callback_func();
      pcVar4 = gsc_time(__time_buf_4 + 0x78,0x80);
      (*p_Var3)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Cannot create udev\n",pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
                ,"gsc_set_device_power_control",0x6d);
    }
    devpath_local._4_4_ = 2;
  }
  else {
    iVar1 = lstat(devpath,(stat *)local_a0);
    if (iVar1 < 0) {
      p_Var3 = igsc_get_log_callback_func();
      if (p_Var3 == (igsc_log_func_t)0x0) {
        pcVar4 = gsc_time(__time_buf_5 + 0x78,0x80);
        syslog(3,"%s: IGSC: (%s:%s():%d) Cannot lstat %s\n",pcVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
               ,"gsc_set_device_power_control",0x73,devpath);
      }
      else {
        p_Var3 = igsc_get_log_callback_func();
        pcVar4 = gsc_time(__time_buf_6 + 0x78,0x80);
        (*p_Var3)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Cannot lstat %s\n",pcVar4,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
                  ,"gsc_set_device_power_control",0x73,devpath);
      }
      igsc_log_func._4_4_ = 1;
    }
    else {
      parent = (udev_device *)udev_device_new_from_devnum(lVar5,99,st._32_8_);
      if (parent == (udev_device *)0x0) {
        p_Var3 = igsc_get_log_callback_func();
        if (p_Var3 == (igsc_log_func_t)0x0) {
          pcVar4 = gsc_time(__time_buf_7 + 0x78,0x80);
          syslog(3,"%s: IGSC: (%s:%s():%d) Cannot create device for %s\n",pcVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
                 ,"gsc_set_device_power_control",0x7b,devpath);
        }
        else {
          p_Var3 = igsc_get_log_callback_func();
          pcVar4 = gsc_time(__time_buf_8 + 0x78,0x80);
          (*p_Var3)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Cannot create device for %s\n",
                    pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
                    ,"gsc_set_device_power_control",0x7b,devpath);
        }
        igsc_log_func._4_4_ = 1;
      }
      else {
        lVar6 = udev_device_get_parent_with_subsystem_devtype(parent,"pci",0);
        if (lVar6 == 0) {
          p_Var3 = igsc_get_log_callback_func();
          if (p_Var3 == (igsc_log_func_t)0x0) {
            pcVar4 = gsc_time(__time_buf_9 + 0x78,0x80);
            uVar7 = udev_device_get_sysname(parent);
            syslog(3,"%s: IGSC: (%s:%s():%d) Can\'t find device parent for \'%s\'\n",pcVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
                   ,"gsc_set_device_power_control",0x84,uVar7);
          }
          else {
            p_Var3 = igsc_get_log_callback_func();
            pcVar4 = gsc_time(__time_buf_10 + 0x78,0x80);
            uVar7 = udev_device_get_sysname();
            (*p_Var3)(IGSC_LOG_LEVEL_ERROR,
                      "%s: IGSC: (%s:%s():%d) Can\'t find device parent for \'%s\'\n",pcVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
                      ,"gsc_set_device_power_control",0x84,uVar7);
          }
          igsc_log_func._4_4_ = 1;
        }
        else {
          igsc_log_func._4_4_ = udev_device_set_sysattr_value(lVar6,"power/control",pcStack_760);
          if (igsc_log_func._4_4_ < 0) {
            p_Var3 = igsc_get_log_callback_func();
            if (p_Var3 == (igsc_log_func_t)0x0) {
              pcVar4 = gsc_time(__time_buf_11 + 0x78,0x80);
              uVar7 = udev_device_get_sysname(lVar6);
              syslog(3,"%s: IGSC: (%s:%s():%d) failed to set power/control on %s %d\n",pcVar4,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
                     ,"gsc_set_device_power_control",0x8c,uVar7,CONCAT44(uVar9,igsc_log_func._4_4_))
              ;
            }
            else {
              p_Var3 = igsc_get_log_callback_func();
              pcVar4 = gsc_time(__time_buf_12 + 0x78,0x80);
              uVar7 = udev_device_get_sysname();
              (*p_Var3)(IGSC_LOG_LEVEL_ERROR,
                        "%s: IGSC: (%s:%s():%d) failed to set power/control on %s %d\n",pcVar4,
                        "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
                        ,"gsc_set_device_power_control",0x8c,uVar7,
                        CONCAT44(uVar9,igsc_log_func._4_4_));
            }
            igsc_log_func._4_4_ = 1;
          }
          else {
            uVar2 = igsc_get_log_level();
            if (uVar2 != 0) {
              p_Var3 = igsc_get_log_callback_func();
              if (p_Var3 == (igsc_log_func_t)0x0) {
                pcVar4 = gsc_time(local_728,0x80);
                uVar7 = udev_device_get_sysname(lVar6);
                syslog(7,"%s: IGSC: (%s:%s():%d) power/control is set to %s on %s\n",pcVar4,
                       "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
                       ,"gsc_set_device_power_control",0x90,pcStack_760,uVar7);
              }
              else {
                p_Var3 = igsc_get_log_callback_func();
                pcVar4 = gsc_time(local_728,0x80);
                uVar7 = udev_device_get_sysname(lVar6);
                (*p_Var3)(IGSC_LOG_LEVEL_DEBUG,
                          "%s: IGSC: (%s:%s():%d) power/control is set to %s on %s\n",pcVar4,
                          "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
                          ,"gsc_set_device_power_control",0x90,pcStack_760,uVar7);
              }
            }
          }
        }
      }
    }
    udev_device_unref(parent);
    udev_unref(lVar5);
    devpath_local._4_4_ = igsc_log_func._4_4_;
  }
LAB_0012bfd9:
  if (*(long *)(in_FS_OFFSET + 0x28) != st.__glibc_reserved[2]) {
    __stack_chk_fail();
  }
  return devpath_local._4_4_;
}

Assistant:

int gsc_set_device_power_control(const char *devpath, uint8_t power_control)
{
    struct udev *udev = NULL;
    struct udev_device *dev = NULL;
    struct udev_device *parent;
    struct stat st;
    const char *val;
    int ret;

    switch (power_control)
    {
    case GSC_POWER_CONTROL_ON:
        val = "on";
        break;
    case GSC_POWER_CONTROL_AUTO:
        val = "auto";
        break;
    default:
        gsc_error("Wrong power control %u\n", power_control);
        return IGSC_ERROR_INTERNAL;
    }

    udev = udev_new();
    if (udev == NULL)
    {
        gsc_error("Cannot create udev\n");
        return IGSC_ERROR_NOMEM;
    }

    if (lstat(devpath, &st) < 0)
    {
        gsc_error("Cannot lstat %s\n", devpath);
        ret = IGSC_ERROR_INTERNAL;
        goto out;
    }

    dev = udev_device_new_from_devnum(udev, 'c', st.st_rdev);
    if (dev == NULL)
    {
        gsc_error("Cannot create device for %s\n", devpath);
        ret = IGSC_ERROR_INTERNAL;
        goto out;
    }

    /* Look for the GFX PCI parent */
    parent = udev_device_get_parent_with_subsystem_devtype(dev, "pci", NULL);
    if (parent == NULL)
    {
        gsc_error("Can't find device parent for '%s'\n", udev_device_get_sysname(dev));
        ret = IGSC_ERROR_INTERNAL;
        goto out;
    }

    ret = udev_device_set_sysattr_value(parent, "power/control", (char *)val);
    if (ret < 0)
    {
        gsc_error("failed to set power/control on %s %d\n", udev_device_get_sysname(parent), ret);
        ret = IGSC_ERROR_INTERNAL;
        goto out;
    }
    gsc_debug("power/control is set to %s on %s\n", val, udev_device_get_sysname(parent));

out:
    udev_device_unref(dev);
    udev_unref(udev);
    return ret;
}